

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void deqp::gles3::Functional::anon_unknown_0::verifyUniformMatrixValues<2>
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,
               GLfloat *values,bool transpose)

{
  ostringstream *this;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  StateQueryMemoryWriteGuard<float[4]> state;
  StateQueryMemoryWriteGuard<float[4]> local_1e8;
  undefined1 local_1b0 [384];
  
  local_1e8.m_postguard[0] = -8.0297587e+18;
  local_1e8.m_postguard[1] = -8.0297587e+18;
  local_1e8.m_postguard[2] = -8.0297587e+18;
  local_1e8.m_postguard[3] = -8.0297587e+18;
  local_1e8.m_value[0] = -8.0297587e+18;
  local_1e8.m_value[1] = -8.0297587e+18;
  local_1e8.m_value[2] = -8.0297587e+18;
  local_1e8.m_value[3] = -8.0297587e+18;
  local_1e8.m_preguard[0] = -8.0297587e+18;
  local_1e8.m_preguard[1] = -8.0297587e+18;
  local_1e8.m_preguard[2] = -8.0297587e+18;
  local_1e8.m_preguard[3] = -8.0297587e+18;
  glu::CallLogWrapper::glGetUniformfv(gl,program,location,local_1e8.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    (&local_1e8,testCtx);
  if (bVar2) {
    this = (ostringstream *)(local_1b0 + 8);
    lVar5 = 0;
    do {
      uVar6 = 0;
      bVar2 = true;
      do {
        bVar4 = bVar2;
        uVar7 = uVar6 | lVar5 * 2;
        uVar1 = (uint)uVar6;
        uVar3 = (int)lVar5 + uVar1 * 2;
        if (!transpose) {
          uVar3 = uVar1 | (uint)(lVar5 * 2);
        }
        if ((values[uVar7] != local_1e8.m_value[(int)uVar3]) ||
           (NAN(values[uVar7]) || NAN(local_1e8.m_value[(int)uVar3]))) {
          local_1b0._0_8_ = testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(this);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,"// ERROR: at index [",0x14);
          std::ostream::operator<<(this,(int)lVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"][",2);
          std::ostream::operator<<(this,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"] expected ",0xb);
          std::ostream::_M_insert<double>((double)values[uVar7]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"; got ",6);
          std::ostream::_M_insert<double>((double)local_1e8.m_value[(int)uVar3]);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
          if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
            tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value")
            ;
          }
        }
        uVar6 = 1;
        bVar2 = false;
      } while (bVar4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  return;
}

Assistant:

void verifyUniformMatrixValues (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, const GLfloat* values, bool transpose)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[N*N]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	for (int y = 0; y < N; ++y)
		for (int x = 0; x < N; ++x)
		{
			const int refIndex = y*N + x;
			const int stateIndex = transpose ? (x*N + y) : (y*N + x);

			if (values[refIndex] != state[stateIndex])
			{
				testCtx.getLog() << TestLog::Message << "// ERROR: at index [" << y << "][" << x << "] expected " << values[refIndex] << "; got " << state[stateIndex] << TestLog::EndMessage;

				if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
			}
		}
}